

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.cpp
# Opt level: O0

int uprv_strnicmp_63(char *str1,char *str2,uint32_t n)

{
  char c;
  byte bVar1;
  byte bVar2;
  uchar c2;
  uint32_t uStack_24;
  uchar c1;
  int rc;
  uint32_t n_local;
  char *str2_local;
  char *str1_local;
  
  if (str1 == (char *)0x0) {
    if (str2 == (char *)0x0) {
      str1_local._4_4_ = 0;
    }
    else {
      str1_local._4_4_ = -1;
    }
  }
  else {
    uStack_24 = n;
    _rc = str2;
    str2_local = str1;
    if (str2 == (char *)0x0) {
      str1_local._4_4_ = 1;
    }
    else {
      while (uStack_24 != 0) {
        c = *_rc;
        if (*str2_local == '\0') {
          if (c == '\0') {
            return 0;
          }
          return -1;
        }
        if (c == '\0') {
          return 1;
        }
        bVar1 = uprv_asciitolower_63(*str2_local);
        bVar2 = uprv_asciitolower_63(c);
        if ((uint)bVar1 - (uint)bVar2 != 0) {
          return (uint)bVar1 - (uint)bVar2;
        }
        str2_local = str2_local + 1;
        _rc = _rc + 1;
        uStack_24 = uStack_24 - 1;
      }
      str1_local._4_4_ = 0;
    }
  }
  return str1_local._4_4_;
}

Assistant:

U_CAPI int U_EXPORT2
uprv_strnicmp(const char *str1, const char *str2, uint32_t n) {
    if(str1==NULL) {
        if(str2==NULL) {
            return 0;
        } else {
            return -1;
        }
    } else if(str2==NULL) {
        return 1;
    } else {
        /* compare non-NULL strings lexically with lowercase */
        int rc;
        unsigned char c1, c2;

        for(; n--;) {
            c1=(unsigned char)*str1;
            c2=(unsigned char)*str2;
            if(c1==0) {
                if(c2==0) {
                    return 0;
                } else {
                    return -1;
                }
            } else if(c2==0) {
                return 1;
            } else {
                /* compare non-zero characters with lowercase */
                rc=(int)(unsigned char)uprv_tolower(c1)-(int)(unsigned char)uprv_tolower(c2);
                if(rc!=0) {
                    return rc;
                }
            }
            ++str1;
            ++str2;
        }
    }

    return 0;
}